

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseGlobalType(WastParser *this,Global *global)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  int __c;
  int __c_00;
  Var *pVVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  Type local_18c;
  Enum local_184;
  undefined1 local_180 [8];
  Var type_1;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12d;
  allocator<char> local_12c;
  allocator<char> local_12b;
  allocator<char> local_12a;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string asStack_108 [32];
  string asStack_e8 [32];
  string asStack_c8 [32];
  iterator local_a8;
  size_type local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  Enum local_7c;
  Type local_78;
  uint local_70;
  Enum local_6c;
  undefined1 local_68 [8];
  Var type;
  Global *global_local;
  WastParser *this_local;
  
  type.field_2._24_8_ = global;
  bVar1 = MatchLpar(this,Mut);
  if (bVar1) {
    *(undefined1 *)(type.field_2._24_8_ + 0x28) = 1;
    Var::Var((Var *)local_68);
    pVVar3 = (Var *)local_68;
    local_6c = (Enum)ParseValueType(this,pVVar3);
    bVar1 = Failed((Result)local_6c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
    else {
      pcVar2 = Var::index((Var *)local_68,(char *)pVVar3,__c);
      Type::Type(&local_78,(int32_t)pcVar2);
      *(Type *)(type.field_2._24_8_ + 0x20) = local_78;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"i32",&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_108,"i64",&local_12a);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_e8,"f32",&local_12b);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_c8,"f64",&local_12c);
      local_a8 = &local_128;
      local_a0 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_12d);
      __l._M_len = local_a0;
      __l._M_array = local_a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_98,__l,&local_12d);
      local_7c = (Enum)ErrorIfLpar(this,&local_98,(char *)0x0);
      bVar1 = Failed((Result)local_7c);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_12d);
      local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8;
      do {
        local_1a0 = local_1a0 + -1;
        std::__cxx11::string::~string((string *)local_1a0);
      } while (local_1a0 != &local_128);
      std::allocator<char>::~allocator(&local_12c);
      std::allocator<char>::~allocator(&local_12b);
      std::allocator<char>::~allocator(&local_12a);
      std::allocator<char>::~allocator(&local_129);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_70 = 1;
      }
      else {
        type_1.field_2._28_4_ = Expect(this,Rpar);
        bVar1 = Failed((Result)type_1.field_2._28_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_70 = 1;
        }
        else {
          local_70 = 0;
        }
      }
    }
    Var::~Var((Var *)local_68);
  }
  else {
    Var::Var((Var *)local_180);
    pVVar3 = (Var *)local_180;
    local_184 = (Enum)ParseValueType(this,pVVar3);
    bVar1 = Failed((Result)local_184);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      pcVar2 = Var::index((Var *)local_180,(char *)pVVar3,__c_00);
      Type::Type(&local_18c,(int32_t)pcVar2);
      *(Type *)(type.field_2._24_8_ + 0x20) = local_18c;
    }
    local_70 = (uint)bVar1;
    Var::~Var((Var *)local_180);
  }
  if (local_70 == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseGlobalType(Global* global) {
  WABT_TRACE(ParseGlobalType);
  if (MatchLpar(TokenType::Mut)) {
    global->mutable_ = true;
    Var type;
    CHECK_RESULT(ParseValueType(&type));
    global->type = Type(type.index());
    CHECK_RESULT(ErrorIfLpar({"i32", "i64", "f32", "f64"}));
    EXPECT(Rpar);
  } else {
    Var type;
    CHECK_RESULT(ParseValueType(&type));
    global->type = Type(type.index());
  }

  return Result::Ok;
}